

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O1

void clean_buffer(void)

{
  munmap(buf,0x160);
  close(shmfd);
  shm_unlink("/your_student_id_SHM");
  sem_close((sem_t *)free_sem);
  sem_close((sem_t *)used_sem);
  sem_close((sem_t *)write_sem);
  sem_unlink("/your_student_id_sem_f");
  sem_unlink("/your_student_id_sem_u");
  sem_unlink("/your_student_id_sem_W");
  fwrite("close\n",6,1,_stdout);
  return;
}

Assistant:

void clean_buffer()
{
    munmap(buf, sizeof(*buf));
    close(shmfd);
    shm_unlink(SHMNAME);
    sem_close(free_sem);
    sem_close(used_sem);
    sem_close(write_sem);
    sem_unlink(SEM_F);
    sem_unlink(SEM_U);
    sem_unlink(SEM_W);
    fprintf(stdout, "close\n");
}